

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

Matrix4d * __thiscall
math::Matrix4d::rotate_z(Matrix4d *__return_storage_ptr__,Matrix4d *this,double r)

{
  int i;
  long lVar1;
  long lVar2;
  Matrix4d ret;
  Matrix4d local_98;
  
  local_98.m_buffer[3][2] = 0.0;
  local_98.m_buffer[3][3] = 0.0;
  local_98.m_buffer[3][0] = 0.0;
  local_98.m_buffer[3][1] = 0.0;
  local_98.m_buffer[2][2] = 0.0;
  local_98.m_buffer[2][3] = 0.0;
  local_98.m_buffer[2][0] = 0.0;
  local_98.m_buffer[2][1] = 0.0;
  local_98.m_buffer[1][2] = 0.0;
  local_98.m_buffer[1][3] = 0.0;
  local_98.m_buffer[1][0] = 0.0;
  local_98.m_buffer[1][1] = 0.0;
  local_98.m_buffer[0][2] = 0.0;
  local_98.m_buffer[0][3] = 0.0;
  lVar1 = 0;
  do {
    lVar2 = 0;
    do {
      if (lVar1 == lVar2) {
        *(undefined8 *)((long)local_98.m_buffer + lVar1 * 0x28) = 0x3ff0000000000000;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  local_98.m_buffer[0][0] = cos(r);
  local_98.m_buffer[0][1] = sin(r);
  local_98.m_buffer[0][1] = -local_98.m_buffer[0][1];
  local_98.m_buffer[1][0] = sin(r);
  local_98.m_buffer[1][1] = cos(r);
  operator*(__return_storage_ptr__,&local_98,this);
  return __return_storage_ptr__;
}

Assistant:

math::Matrix4d math::Matrix4d::rotate_z(double r) const
{
    Matrix4d ret{identity()};
    ret(0, 0) = std::cos(r);
    ret(0, 1) = -std::sin(r);
    ret(1, 0) = std::sin(r);
    ret(1, 1) = std::cos(r);
    return (ret * (*this));
}